

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

void __thiscall
slang::ast::Compilation::checkExternIfaceMethods
          (Compilation *this,
          span<const_slang::ast::MethodPrototypeSymbol_*const,_18446744073709551615UL> protos)

{
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  bool bVar1;
  reference ppMVar2;
  ExternImpl *pEVar3;
  Scope *this_00;
  Symbol *pSVar4;
  SourceLocation in_RDX;
  Scope *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  DiagCode unaff_retaddr;
  Diagnostic *diag;
  Symbol *parent;
  Scope *scope;
  MethodPrototypeSymbol *proto;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::MethodPrototypeSymbol_*const,_18446744073709551615UL> *__range2;
  span<const_slang::ast::MethodPrototypeSymbol_*const,_18446744073709551615UL>
  *in_stack_ffffffffffffff48;
  Diagnostic *in_stack_ffffffffffffff50;
  span<const_slang::ast::MethodPrototypeSymbol_*const,_18446744073709551615UL>
  *in_stack_ffffffffffffff58;
  byte local_99;
  Diagnostic *this_01;
  SourceLocation SVar6;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar7;
  bitmask<slang::ast::MethodFlags> local_3a;
  MethodPrototypeSymbol *local_38;
  MethodPrototypeSymbol **local_30;
  __normal_iterator<const_slang::ast::MethodPrototypeSymbol_*const_*,_std::span<const_slang::ast::MethodPrototypeSymbol_*const,_18446744073709551615UL>_>
  local_28;
  undefined1 *local_20;
  
  local_20 = &stack0xfffffffffffffff0;
  local_28._M_current =
       (MethodPrototypeSymbol **)
       std::span<const_slang::ast::MethodPrototypeSymbol_*const,_18446744073709551615UL>::begin
                 (in_stack_ffffffffffffff48);
  local_30 = (MethodPrototypeSymbol **)
             std::span<const_slang::ast::MethodPrototypeSymbol_*const,_18446744073709551615UL>::end
                       (in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::
                 operator==<const_slang::ast::MethodPrototypeSymbol_*const_*,_std::span<const_slang::ast::MethodPrototypeSymbol_*const,_18446744073709551615UL>_>
                           ((__normal_iterator<const_slang::ast::MethodPrototypeSymbol_*const_*,_std::span<const_slang::ast::MethodPrototypeSymbol_*const,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffff50,
                            (__normal_iterator<const_slang::ast::MethodPrototypeSymbol_*const_*,_std::span<const_slang::ast::MethodPrototypeSymbol_*const,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffff48), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppMVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::MethodPrototypeSymbol_*const_*,_std::span<const_slang::ast::MethodPrototypeSymbol_*const,_18446744073709551615UL>_>
              ::operator*(&local_28);
    local_38 = *ppMVar2;
    pEVar3 = MethodPrototypeSymbol::getFirstExternImpl(local_38);
    local_99 = 0;
    if (pEVar3 == (ExternImpl *)0x0) {
      bitmask<slang::ast::MethodFlags>::bitmask(&local_3a,ForkJoin);
      bVar1 = bitmask<slang::ast::MethodFlags>::has
                        ((bitmask<slang::ast::MethodFlags> *)in_stack_ffffffffffffff50,
                         (bitmask<slang::ast::MethodFlags> *)in_stack_ffffffffffffff48);
      local_99 = bVar1 ^ 0xff;
    }
    if ((local_99 & 1) != 0) {
      this_00 = Symbol::getParentScope(&local_38->super_Symbol);
      pSVar4 = Scope::asSymbol(this_00);
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&pSVar4->name);
      if ((!bVar1) &&
         (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            (&(local_38->super_Symbol).name), !bVar1)) {
        uVar7 = 0x12000d;
        SVar6 = (local_38->super_Symbol).location;
        in_stack_ffffffffffffff50 = Scope::addDiag(in_RSI,unaff_retaddr,in_RDX);
        if (local_38->subroutineKind == Function) {
          bVar5 = sv((char *)in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
          this_01 = (Diagnostic *)bVar5._M_str;
        }
        else {
          bVar5 = sv((char *)in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
          this_01 = (Diagnostic *)bVar5._M_str;
        }
        arg._M_str._0_4_ = in_stack_ffffffffffffffa0;
        arg._M_len = (size_t)SVar6;
        arg._M_str._4_4_ = uVar7;
        Diagnostic::operator<<(this_01,arg);
        arg_00._M_str._0_4_ = in_stack_ffffffffffffffa0;
        arg_00._M_len = (size_t)SVar6;
        arg_00._M_str._4_4_ = uVar7;
        Diagnostic::operator<<(this_01,arg_00);
        arg_01._M_str._0_4_ = in_stack_ffffffffffffffa0;
        arg_01._M_len = (size_t)SVar6;
        arg_01._M_str._4_4_ = uVar7;
        Diagnostic::operator<<(this_01,arg_01);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::MethodPrototypeSymbol_*const_*,_std::span<const_slang::ast::MethodPrototypeSymbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void Compilation::checkExternIfaceMethods(std::span<const MethodPrototypeSymbol* const> protos) {
    for (auto proto : protos) {
        if (!proto->getFirstExternImpl() && !proto->flags.has(MethodFlags::ForkJoin)) {
            auto scope = proto->getParentScope();
            SLANG_ASSERT(scope);

            auto& parent = scope->asSymbol();
            if (!parent.name.empty() && !proto->name.empty()) {
                auto& diag = scope->addDiag(diag::MissingExternImpl, proto->location);
                diag << (proto->subroutineKind == SubroutineKind::Function ? "function"sv
                                                                           : "task"sv);
                diag << parent.name << proto->name;
            }
        }
    }
}